

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O0

void __thiscall
Opcode::AABBTreeCollider::_CollideTriBox(AABBTreeCollider *this,AABBQuantizedNoLeafNode *b)

{
  udword uVar1;
  uint uVar2;
  MeshInterface *pMVar3;
  bool bVar4;
  udword uVar5;
  int *piVar6;
  Point *pPVar7;
  Point *pPVar8;
  Point *pPVar9;
  Container *pCVar10;
  Point *pPVar11;
  Point *pPVar12;
  Point *pPVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float local_e44;
  float local_e40;
  float local_e3c;
  float local_e34;
  float local_e30;
  float local_e2c;
  float local_e24;
  float local_e20;
  float local_e1c;
  float local_e14;
  float local_e10;
  float local_e0c;
  float local_e04;
  float local_e00;
  float local_dfc;
  float local_df4;
  float local_df0;
  float local_dec;
  float local_dc8 [2];
  Point eb;
  Point Pb;
  QuantizedAABB *bb;
  AABBQuantizedNoLeafNode *b_local;
  AABBTreeCollider *this_local;
  float tmp_8;
  float tmp_7;
  float fex2;
  float tmp_6;
  float fez2;
  float fey2;
  Point e2;
  float tmp_5;
  float tmp_4;
  float fex1;
  float tmp_3;
  float fez1;
  float fey1;
  float tmp_2;
  float tmp_1;
  float fex0;
  float tmp;
  float fez0;
  float fey0;
  float max;
  float min;
  float rad;
  float local_cd0;
  float d;
  Point normal;
  Point e1;
  Point e0;
  Point v2;
  Point v1;
  Point v0;
  int local_c5c;
  VertexPointers VP_1;
  IndexedTriangle *T_1;
  float c_5;
  float c_4;
  float tmp_10;
  float isect2_1 [2];
  float isect1_1 [2];
  float xxyy_1;
  float yy_1;
  float xx_1;
  float y1_1;
  float y0_1;
  float f_1;
  float e_1;
  float d_2;
  float x1_1;
  float x0_1;
  float c_3;
  float b_2;
  float a_1;
  float up2_1;
  float up1_1;
  float up0_1;
  float vp2_1;
  float vp1_1;
  float vp0_1;
  float cc_1;
  float bb_2;
  short index_1;
  float max_2;
  Point D_1;
  float dv0dv2_1;
  float dv0dv1_1;
  float dv2_1;
  float dv1_1;
  float dv0_1;
  float d2_1;
  Point N2_1;
  float local_ac4;
  float fStack_ac0;
  float du0du2_1;
  float du0du1_1;
  float du2_1;
  float du1_1;
  float du0_1;
  undefined1 local_a90 [4];
  float d1_1;
  Point N1_1;
  float local_a78;
  float fStack_a74;
  Point E2_1;
  Point E1_1;
  int local_a24;
  VertexPointers VP;
  IndexedTriangle *T;
  float c_2;
  float c_1;
  float tmp_9;
  float isect2 [2];
  float isect1 [2];
  float xxyy;
  float yy;
  float xx;
  float y1;
  float y0;
  float f;
  float e;
  float d_1;
  float x1;
  float x0;
  float c;
  float b_1;
  float a;
  float up2;
  float up1;
  float up0;
  float vp2;
  float vp1;
  float vp0;
  float cc;
  float bb_1;
  short index;
  float max_1;
  Point D;
  float dv0dv2;
  float dv0dv1;
  float dv2;
  float dv1;
  float dv0;
  float d2;
  Point N2;
  float local_82c;
  float fStack_828;
  float du0du2;
  float du0du1;
  float du2;
  float du1;
  float du0;
  undefined1 local_7f8 [4];
  float d1;
  Point N1;
  float local_7e0;
  float fStack_7dc;
  Point E2;
  Point E1;
  int local_78c;
  uint local_e8;
  udword q;
  float local_d8 [2];
  Point vmax;
  Point vmin;
  
  eb.y = (float)(int)(b->mAABB).mCenter[0] * (this->mCenterCoeff1).x;
  eb.z = (float)(int)(b->mAABB).mCenter[1] * (this->mCenterCoeff1).y;
  fVar14 = (float)(int)(b->mAABB).mCenter[2] * (this->mCenterCoeff1).z;
  local_dc8[0] = (float)(b->mAABB).mExtents[0] * (this->mExtentsCoeff1).x;
  local_dc8[1] = (float)(b->mAABB).mExtents[1] * (this->mExtentsCoeff1).y;
  eb.x = (float)(b->mAABB).mExtents[2] * (this->mExtentsCoeff1).z;
  this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
  fVar15 = this->mLeafVerts[0].x - eb.y;
  fVar16 = this->mLeafVerts[1].x - eb.y;
  fVar17 = this->mLeafVerts[2].x - eb.y;
  if (fVar16 <= fVar15) {
    local_df4 = fVar17;
    if (fVar16 < fVar17) {
      local_df4 = fVar16;
    }
    local_df0 = local_df4;
  }
  else {
    local_dec = fVar17;
    if (fVar15 < fVar17) {
      local_dec = fVar15;
    }
    local_df0 = local_dec;
  }
  if (local_df0 <= local_dc8[0]) {
    if (fVar16 <= fVar15) {
      local_e04 = fVar15;
      if (fVar15 < fVar17) {
        local_e04 = fVar17;
      }
      local_e00 = local_e04;
    }
    else {
      local_dfc = fVar16;
      if (fVar16 < fVar17) {
        local_dfc = fVar17;
      }
      local_e00 = local_dfc;
    }
    if (-local_dc8[0] <= local_e00) {
      fVar18 = this->mLeafVerts[0].y - eb.z;
      fVar19 = this->mLeafVerts[1].y - eb.z;
      fVar20 = this->mLeafVerts[2].y - eb.z;
      if (fVar19 <= fVar18) {
        local_e14 = fVar20;
        if (fVar19 < fVar20) {
          local_e14 = fVar19;
        }
        local_e10 = local_e14;
      }
      else {
        local_e0c = fVar20;
        if (fVar18 < fVar20) {
          local_e0c = fVar18;
        }
        local_e10 = local_e0c;
      }
      if (local_e10 <= local_dc8[1]) {
        if (fVar19 <= fVar18) {
          local_e24 = fVar18;
          if (fVar18 < fVar20) {
            local_e24 = fVar20;
          }
          local_e20 = local_e24;
        }
        else {
          local_e1c = fVar19;
          if (fVar19 < fVar20) {
            local_e1c = fVar20;
          }
          local_e20 = local_e1c;
        }
        if (-local_dc8[1] <= local_e20) {
          fVar21 = this->mLeafVerts[0].z - fVar14;
          fVar22 = this->mLeafVerts[1].z - fVar14;
          fVar14 = this->mLeafVerts[2].z - fVar14;
          if (fVar22 <= fVar21) {
            local_e34 = fVar14;
            if (fVar22 < fVar14) {
              local_e34 = fVar22;
            }
            local_e30 = local_e34;
          }
          else {
            local_e2c = fVar14;
            if (fVar21 < fVar14) {
              local_e2c = fVar21;
            }
            local_e30 = local_e2c;
          }
          if (local_e30 <= eb.x) {
            if (fVar22 <= fVar21) {
              local_e44 = fVar21;
              if (fVar21 < fVar14) {
                local_e44 = fVar14;
              }
              local_e40 = local_e44;
            }
            else {
              local_e3c = fVar22;
              if (fVar22 < fVar14) {
                local_e3c = fVar14;
              }
              local_e40 = local_e3c;
            }
            if (-eb.x <= local_e40) {
              fVar28 = fVar16 - fVar15;
              fVar26 = fVar19 - fVar18;
              fVar23 = fVar22 - fVar21;
              fVar29 = fVar17 - fVar16;
              fVar27 = fVar20 - fVar19;
              fVar24 = fVar14 - fVar22;
              local_cd0 = fVar26 * fVar24 + -(fVar23 * fVar27);
              d = fVar23 * fVar29 + -(fVar28 * fVar24);
              normal.x = fVar28 * fVar27 + -(fVar26 * fVar29);
              fVar25 = -normal.x * fVar21 + -local_cd0 * fVar15 + -d * fVar18;
              for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
                if ((&local_cd0)[local_e8] <= 0.0) {
                  (&vmax.y)[local_e8] = local_dc8[local_e8];
                  local_d8[local_e8] = -local_dc8[local_e8];
                }
                else {
                  (&vmax.y)[local_e8] = -local_dc8[local_e8];
                  local_d8[local_e8] = local_dc8[local_e8];
                }
              }
              if (normal.x * vmin.x + local_cd0 * vmax.y + d * vmax.z + fVar25 <= 0.0) {
                if (normal.x * vmax.x + local_cd0 * local_d8[0] + d * local_d8[1] + fVar25 < 0.0) {
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                }
              }
              else {
                bVar4 = false;
              }
              if (bVar4) {
                if ((this->mFullPrimBoxTest & 1U) == 0) {
LAB_0028671c:
                  local_c5c = 1;
                }
                else {
                  fey0 = fVar23 * fVar18 + -(fVar26 * fVar21);
                  fVar25 = fVar23 * fVar20 + -(fVar26 * fVar14);
                  fez0 = fVar25;
                  if (fVar25 < fey0) {
                    fez0 = fey0;
                    fey0 = fVar25;
                  }
                  fVar25 = ABS(fVar23) * local_dc8[1] + ABS(fVar26) * eb.x;
                  if ((fVar25 < fey0) || (fez0 < -fVar25)) {
                    local_c5c = 0;
                  }
                  else {
                    fey0 = fVar28 * fVar21 + -(fVar23 * fVar15);
                    fVar25 = fVar28 * fVar14 + -(fVar23 * fVar17);
                    fez0 = fVar25;
                    if (fVar25 < fey0) {
                      fez0 = fey0;
                      fey0 = fVar25;
                    }
                    fVar23 = ABS(fVar23) * local_dc8[0] + ABS(fVar28) * eb.x;
                    if ((fVar23 < fey0) || (fez0 < -fVar23)) {
                      local_c5c = 0;
                    }
                    else {
                      fey0 = fVar26 * fVar16 + -(fVar28 * fVar19);
                      fVar23 = fVar26 * fVar17 + -(fVar28 * fVar20);
                      fez0 = fVar23;
                      if (fVar23 < fey0) {
                        fez0 = fey0;
                        fey0 = fVar23;
                      }
                      fVar23 = ABS(fVar26) * local_dc8[0] + ABS(fVar28) * local_dc8[1];
                      if ((fVar23 < fey0) || (fez0 < -fVar23)) {
                        local_c5c = 0;
                      }
                      else {
                        fey0 = fVar24 * fVar18 + -(fVar27 * fVar21);
                        fVar23 = fVar24 * fVar20 + -(fVar27 * fVar14);
                        fez0 = fVar23;
                        if (fVar23 < fey0) {
                          fez0 = fey0;
                          fey0 = fVar23;
                        }
                        fVar23 = ABS(fVar24) * local_dc8[1] + ABS(fVar27) * eb.x;
                        if ((fVar23 < fey0) || (fez0 < -fVar23)) {
                          local_c5c = 0;
                        }
                        else {
                          fey0 = fVar29 * fVar21 + -(fVar24 * fVar15);
                          fVar14 = fVar29 * fVar14 + -(fVar24 * fVar17);
                          fez0 = fVar14;
                          if (fVar14 < fey0) {
                            fez0 = fey0;
                            fey0 = fVar14;
                          }
                          fVar14 = ABS(fVar24) * local_dc8[0] + ABS(fVar29) * eb.x;
                          if ((fVar14 < fey0) || (fez0 < -fVar14)) {
                            local_c5c = 0;
                          }
                          else {
                            fey0 = fVar27 * fVar15 + -(fVar29 * fVar18);
                            fVar14 = fVar27 * fVar16 + -(fVar29 * fVar19);
                            fez0 = fVar14;
                            if (fVar14 < fey0) {
                              fez0 = fey0;
                              fey0 = fVar14;
                            }
                            fVar14 = ABS(fVar27) * local_dc8[0] + ABS(fVar29) * local_dc8[1];
                            if ((fVar14 < fey0) || (fez0 < -fVar14)) {
                              local_c5c = 0;
                            }
                            else {
                              fVar24 = this->mLeafVerts[0].x - this->mLeafVerts[2].x;
                              fVar23 = this->mLeafVerts[0].y - this->mLeafVerts[2].y;
                              fVar14 = this->mLeafVerts[0].z - this->mLeafVerts[2].z;
                              fey0 = fVar14 * fVar18 + -(fVar23 * fVar21);
                              fVar18 = fVar14 * fVar19 + -(fVar23 * fVar22);
                              fez0 = fVar18;
                              if (fVar18 < fey0) {
                                fez0 = fey0;
                                fey0 = fVar18;
                              }
                              fVar18 = ABS(fVar14) * local_dc8[1] + ABS(fVar23) * eb.x;
                              if ((fVar18 < fey0) || (fez0 < -fVar18)) {
                                local_c5c = 0;
                                bVar4 = true;
                              }
                              else {
                                fey0 = fVar24 * fVar21 + -(fVar14 * fVar15);
                                fVar15 = fVar24 * fVar22 + -(fVar14 * fVar16);
                                fez0 = fVar15;
                                if (fVar15 < fey0) {
                                  fez0 = fey0;
                                  fey0 = fVar15;
                                }
                                fVar15 = ABS(fVar14) * local_dc8[0] + ABS(fVar24) * eb.x;
                                if ((fVar15 < fey0) || (fez0 < -fVar15)) {
                                  local_c5c = 0;
                                  bVar4 = true;
                                }
                                else {
                                  fey0 = fVar23 * fVar16 + -(fVar24 * fVar19);
                                  fVar15 = fVar23 * fVar17 + -(fVar24 * fVar20);
                                  fez0 = fVar15;
                                  if (fVar15 < fey0) {
                                    fez0 = fey0;
                                    fey0 = fVar15;
                                  }
                                  fVar15 = ABS(fVar23) * local_dc8[0] + ABS(fVar24) * local_dc8[1];
                                  if ((fVar15 < fey0) || (fez0 < -fVar15)) {
                                    local_c5c = 0;
                                    bVar4 = true;
                                  }
                                  else {
                                    bVar4 = false;
                                  }
                                }
                              }
                              if (!bVar4) goto LAB_0028671c;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                local_c5c = 0;
              }
            }
            else {
              local_c5c = 0;
            }
          }
          else {
            local_c5c = 0;
          }
        }
        else {
          local_c5c = 0;
        }
      }
      else {
        local_c5c = 0;
      }
    }
    else {
      local_c5c = 0;
    }
  }
  else {
    local_c5c = 0;
  }
  if (local_c5c == 0) {
    return;
  }
  if ((b->mPosData & 1) == 0) {
    _CollideTriBox(this,(AABBQuantizedNoLeafNode *)b->mPosData);
  }
  else {
    uVar5 = (udword)(b->mPosData >> 1);
    pMVar3 = this->mIMesh1;
    piVar6 = (int *)((long)pMVar3->mTris->mVRef + (ulong)(uVar5 * pMVar3->mTriStride));
    pPVar7 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(*piVar6 * pMVar3->mVertexStride));
    pPVar8 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[1] * pMVar3->mVertexStride));
    pPVar9 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[2] * pMVar3->mVertexStride));
    pPVar13 = this->mLeafVerts;
    pPVar12 = this->mLeafVerts + 1;
    pPVar11 = this->mLeafVerts + 2;
    this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
    fVar15 = this->mLeafVerts[1].z - this->mLeafVerts[0].z;
    E2.y = pPVar12->x - pPVar13->x;
    E2.z = this->mLeafVerts[1].y - this->mLeafVerts[0].y;
    fVar16 = this->mLeafVerts[2].z - this->mLeafVerts[0].z;
    local_7e0 = pPVar11->x - pPVar13->x;
    fStack_7dc = this->mLeafVerts[2].y - this->mLeafVerts[0].y;
    E2.z = SUB84(E2._4_8_,4);
    fStack_7dc = SUB84(_local_7e0,4);
    local_7f8 = (undefined1  [4])(E2.z * fVar16 + -(fVar15 * fStack_7dc));
    local_7e0 = (float)_local_7e0;
    E2.y = (float)E2._4_8_;
    d1 = fVar15 * local_7e0 + -(E2.y * fVar16);
    N1.x = E2.y * fStack_7dc + -(E2.z * local_7e0);
    fVar15 = -N1.x * this->mLeafVerts[0].z +
             -(float)local_7f8 * pPVar13->x + -d1 * this->mLeafVerts[0].y;
    du2 = N1.x * pPVar7->z + (float)local_7f8 * pPVar7->x + d1 * pPVar7->y + fVar15;
    du0du1 = N1.x * pPVar8->z + (float)local_7f8 * pPVar8->x + d1 * pPVar8->y + fVar15;
    du0du2 = N1.x * pPVar9->z + (float)local_7f8 * pPVar9->x + d1 * pPVar9->y + fVar15;
    if (ABS(du2) < 1e-06) {
      du2 = 0.0;
    }
    if (ABS(du0du1) < 1e-06) {
      du0du1 = 0.0;
    }
    if (ABS(du0du2) < 1e-06) {
      du0du2 = 0.0;
    }
    if ((du2 * du0du1 <= 0.0) || (du2 * du0du2 <= 0.0)) {
      fVar15 = pPVar8->z - pPVar7->z;
      local_82c = pPVar8->x - pPVar7->x;
      fStack_828 = pPVar8->y - pPVar7->y;
      fVar16 = pPVar9->z - pPVar7->z;
      N2.y = pPVar9->x - pPVar7->x;
      N2.z = pPVar9->y - pPVar7->y;
      E2.z = (float)((ulong)_local_82c >> 0x20);
      fStack_7dc = SUB84(N2._4_8_,4);
      fVar14 = E2.z * fVar16 + -(fVar15 * fStack_7dc);
      local_7e0 = (float)N2._4_8_;
      E2.y = (float)_local_82c;
      fVar17 = fVar15 * local_7e0 + -(E2.y * fVar16);
      fVar15 = E2.y * fStack_7dc + -(E2.z * local_7e0);
      fVar16 = -fVar15 * pPVar7->z + -fVar14 * pPVar7->x + -fVar17 * pPVar7->y;
      dv2 = fVar15 * this->mLeafVerts[0].z + fVar14 * pPVar13->x + fVar17 * this->mLeafVerts[0].y +
            fVar16;
      dv0dv1 = fVar15 * this->mLeafVerts[1].z + fVar14 * pPVar12->x + fVar17 * this->mLeafVerts[1].y
               + fVar16;
      dv0dv2 = fVar15 * this->mLeafVerts[2].z + fVar14 * pPVar11->x + fVar17 * this->mLeafVerts[2].y
               + fVar16;
      if (ABS(dv2) < 1e-06) {
        dv2 = 0.0;
      }
      if (ABS(dv0dv1) < 1e-06) {
        dv0dv1 = 0.0;
      }
      if (ABS(dv0dv2) < 1e-06) {
        dv0dv2 = 0.0;
      }
      if ((dv2 * dv0dv1 <= 0.0) || (dv2 * dv0dv2 <= 0.0)) {
        fVar16 = ABS(d1 * fVar15 + -(N1.x * fVar17));
        fVar15 = ABS(N1.x * fVar14 + -((float)local_7f8 * fVar15));
        bb_1 = fVar16;
        if (fVar16 < fVar15) {
          bb_1 = fVar15;
        }
        cc._2_2_ = (ushort)(fVar16 < fVar15);
        if (bb_1 < ABS((float)local_7f8 * fVar17 + -(d1 * fVar14))) {
          cc._2_2_ = 2;
        }
        fVar15 = (&pPVar13->x)[(short)cc._2_2_];
        c = (&pPVar12->x)[(short)cc._2_2_];
        fVar16 = (&pPVar11->x)[(short)cc._2_2_];
        fVar17 = (&pPVar7->x)[(short)cc._2_2_];
        f = (&pPVar8->x)[(short)cc._2_2_];
        fVar14 = (&pPVar9->x)[(short)cc._2_2_];
        if (dv2 * dv0dv1 <= 0.0) {
          if (0.0 < dv2 * dv0dv2) {
            x0 = (fVar15 - c) * dv0dv1;
            x1 = (fVar16 - c) * dv0dv1;
            d_1 = dv0dv1 - dv2;
            e = dv0dv1 - dv0dv2;
          }
          else if (((0.0 < dv0dv1 * dv0dv2) || (dv2 != 0.0)) || (NAN(dv2))) {
            x0 = (c - fVar15) * dv2;
            x1 = (fVar16 - fVar15) * dv2;
            d_1 = dv2 - dv0dv1;
            e = dv2 - dv0dv2;
            c = fVar15;
          }
          else {
            if ((dv0dv1 != 0.0) || (NAN(dv0dv1))) {
              x0 = (fVar15 - c) * dv0dv1;
              x1 = (fVar16 - c) * dv0dv1;
              e = dv0dv1 - dv0dv2;
              dv0dv2 = dv0dv1;
            }
            else {
              if ((dv0dv2 == 0.0) && (!NAN(dv0dv2))) {
                local_78c = CoplanarTriTri((Point *)local_7f8,pPVar13,pPVar12,pPVar11,pPVar7,pPVar8,
                                           pPVar9);
                goto LAB_0028834b;
              }
              x0 = (fVar15 - fVar16) * dv0dv2;
              x1 = (c - fVar16) * dv0dv2;
              e = dv0dv2 - dv0dv1;
              c = fVar16;
            }
            d_1 = dv0dv2 - dv2;
          }
        }
        else {
          x0 = (fVar15 - fVar16) * dv0dv2;
          x1 = (c - fVar16) * dv0dv2;
          d_1 = dv0dv2 - dv2;
          e = dv0dv2 - dv0dv1;
          c = fVar16;
        }
        if (du2 * du0du1 <= 0.0) {
          if (du2 * du0du2 <= 0.0) {
            if (((0.0 < du0du1 * du0du2) || (du2 != 0.0)) || (NAN(du2))) {
              y0 = (f - fVar17) * du2;
              y1 = (fVar14 - fVar17) * du2;
              xx = du2 - du0du1;
              yy = du2 - du0du2;
              f = fVar17;
            }
            else {
              if ((du0du1 != 0.0) || (NAN(du0du1))) {
                y0 = (fVar17 - f) * du0du1;
                y1 = (fVar14 - f) * du0du1;
                yy = du0du1 - du0du2;
                du0du2 = du0du1;
              }
              else {
                if ((du0du2 == 0.0) && (!NAN(du0du2))) {
                  local_78c = CoplanarTriTri((Point *)local_7f8,pPVar13,pPVar12,pPVar11,pPVar7,
                                             pPVar8,pPVar9);
                  goto LAB_0028834b;
                }
                y0 = (fVar17 - fVar14) * du0du2;
                y1 = (f - fVar14) * du0du2;
                yy = du0du2 - du0du1;
                f = fVar14;
              }
              xx = du0du2 - du2;
            }
          }
          else {
            y0 = (fVar17 - f) * du0du1;
            y1 = (fVar14 - f) * du0du1;
            xx = du0du1 - du2;
            yy = du0du1 - du0du2;
          }
        }
        else {
          y0 = (fVar17 - fVar14) * du0du2;
          y1 = (f - fVar14) * du0du2;
          xx = du0du2 - du2;
          yy = du0du2 - du0du1;
          f = fVar14;
        }
        fVar15 = d_1 * e;
        fVar16 = xx * yy;
        fVar17 = c * fVar15 * fVar16;
        fVar14 = x0 * e * fVar16 + fVar17;
        isect2[1] = x1 * d_1 * fVar16 + fVar17;
        fVar16 = f * fVar15 * fVar16;
        fVar17 = y0 * fVar15 * yy + fVar16;
        tmp_9 = y1 * fVar15 * xx + fVar16;
        isect2[0] = fVar14;
        if (isect2[1] < fVar14) {
          isect2[0] = isect2[1];
          isect2[1] = fVar14;
        }
        c_1 = fVar17;
        if (tmp_9 < fVar17) {
          c_1 = tmp_9;
          tmp_9 = fVar17;
        }
        if ((isect2[1] < c_1) || (tmp_9 < isect2[0])) {
          local_78c = 0;
        }
        else {
          local_78c = 1;
        }
      }
      else {
        local_78c = 0;
      }
    }
    else {
      local_78c = 0;
    }
LAB_0028834b:
    if (local_78c != 0) {
      pCVar10 = &this->mPairs;
      uVar1 = this->mLeafIndex;
      if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
        IceCore::Container::Resize(pCVar10,1);
      }
      uVar2 = (this->mPairs).mCurNbEntries;
      (this->mPairs).mCurNbEntries = uVar2 + 1;
      (this->mPairs).mEntries[uVar2] = uVar1;
      if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
        IceCore::Container::Resize(pCVar10,1);
      }
      uVar2 = (this->mPairs).mCurNbEntries;
      (this->mPairs).mCurNbEntries = uVar2 + 1;
      (this->mPairs).mEntries[uVar2] = uVar5;
      (this->super_Collider).mFlags = (this->super_Collider).mFlags | 4;
    }
  }
  if (((this->super_Collider).mFlags & 5) == 5) {
    return;
  }
  if ((b->mNegData & 1) == 0) {
    _CollideTriBox(this,(AABBQuantizedNoLeafNode *)b->mNegData);
    return;
  }
  uVar5 = (udword)(b->mNegData >> 1);
  pMVar3 = this->mIMesh1;
  piVar6 = (int *)((long)pMVar3->mTris->mVRef + (ulong)(uVar5 * pMVar3->mTriStride));
  pPVar7 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(*piVar6 * pMVar3->mVertexStride));
  pPVar8 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[1] * pMVar3->mVertexStride));
  pPVar9 = (Point *)((long)&pMVar3->mVerts->x + (ulong)(piVar6[2] * pMVar3->mVertexStride));
  pPVar13 = this->mLeafVerts;
  pPVar12 = this->mLeafVerts + 1;
  pPVar11 = this->mLeafVerts + 2;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar15 = this->mLeafVerts[1].z - this->mLeafVerts[0].z;
  E2_1.y = pPVar12->x - pPVar13->x;
  E2_1.z = this->mLeafVerts[1].y - this->mLeafVerts[0].y;
  fVar16 = this->mLeafVerts[2].z - this->mLeafVerts[0].z;
  local_a78 = pPVar11->x - pPVar13->x;
  fStack_a74 = this->mLeafVerts[2].y - this->mLeafVerts[0].y;
  E2_1.z = SUB84(E2_1._4_8_,4);
  fStack_a74 = SUB84(_local_a78,4);
  local_a90 = (undefined1  [4])(E2_1.z * fVar16 + -(fVar15 * fStack_a74));
  local_a78 = (float)_local_a78;
  E2_1.y = (float)E2_1._4_8_;
  d1_1 = fVar15 * local_a78 + -(E2_1.y * fVar16);
  N1_1.x = E2_1.y * fStack_a74 + -(E2_1.z * local_a78);
  fVar15 = -N1_1.x * this->mLeafVerts[0].z +
           -(float)local_a90 * pPVar13->x + -d1_1 * this->mLeafVerts[0].y;
  du2_1 = N1_1.x * pPVar7->z + (float)local_a90 * pPVar7->x + d1_1 * pPVar7->y + fVar15;
  du0du1_1 = N1_1.x * pPVar8->z + (float)local_a90 * pPVar8->x + d1_1 * pPVar8->y + fVar15;
  du0du2_1 = N1_1.x * pPVar9->z + (float)local_a90 * pPVar9->x + d1_1 * pPVar9->y + fVar15;
  if (ABS(du2_1) < 1e-06) {
    du2_1 = 0.0;
  }
  if (ABS(du0du1_1) < 1e-06) {
    du0du1_1 = 0.0;
  }
  if (ABS(du0du2_1) < 1e-06) {
    du0du2_1 = 0.0;
  }
  if ((du2_1 * du0du1_1 <= 0.0) || (du2_1 * du0du2_1 <= 0.0)) {
    fVar15 = pPVar8->z - pPVar7->z;
    local_ac4 = pPVar8->x - pPVar7->x;
    fStack_ac0 = pPVar8->y - pPVar7->y;
    fVar16 = pPVar9->z - pPVar7->z;
    N2_1.y = pPVar9->x - pPVar7->x;
    N2_1.z = pPVar9->y - pPVar7->y;
    E2_1.z = (float)((ulong)_local_ac4 >> 0x20);
    fStack_a74 = SUB84(N2_1._4_8_,4);
    fVar14 = E2_1.z * fVar16 + -(fVar15 * fStack_a74);
    local_a78 = (float)N2_1._4_8_;
    E2_1.y = (float)_local_ac4;
    fVar17 = fVar15 * local_a78 + -(E2_1.y * fVar16);
    fVar15 = E2_1.y * fStack_a74 + -(E2_1.z * local_a78);
    fVar16 = -fVar15 * pPVar7->z + -fVar14 * pPVar7->x + -fVar17 * pPVar7->y;
    dv2_1 = fVar15 * this->mLeafVerts[0].z + fVar14 * pPVar13->x + fVar17 * this->mLeafVerts[0].y +
            fVar16;
    dv0dv1_1 = fVar15 * this->mLeafVerts[1].z + fVar14 * pPVar12->x + fVar17 * this->mLeafVerts[1].y
               + fVar16;
    dv0dv2_1 = fVar15 * this->mLeafVerts[2].z + fVar14 * pPVar11->x + fVar17 * this->mLeafVerts[2].y
               + fVar16;
    if (ABS(dv2_1) < 1e-06) {
      dv2_1 = 0.0;
    }
    if (ABS(dv0dv1_1) < 1e-06) {
      dv0dv1_1 = 0.0;
    }
    if (ABS(dv0dv2_1) < 1e-06) {
      dv0dv2_1 = 0.0;
    }
    if ((dv2_1 * dv0dv1_1 <= 0.0) || (dv2_1 * dv0dv2_1 <= 0.0)) {
      fVar16 = ABS(d1_1 * fVar15 + -(N1_1.x * fVar17));
      fVar15 = ABS(N1_1.x * fVar14 + -((float)local_a90 * fVar15));
      bb_2 = fVar16;
      if (fVar16 < fVar15) {
        bb_2 = fVar15;
      }
      cc_1._2_2_ = (ushort)(fVar16 < fVar15);
      if (bb_2 < ABS((float)local_a90 * fVar17 + -(d1_1 * fVar14))) {
        cc_1._2_2_ = 2;
      }
      fVar15 = (&pPVar13->x)[(short)cc_1._2_2_];
      c_3 = (&pPVar12->x)[(short)cc_1._2_2_];
      fVar16 = (&pPVar11->x)[(short)cc_1._2_2_];
      fVar17 = (&pPVar7->x)[(short)cc_1._2_2_];
      f_1 = (&pPVar8->x)[(short)cc_1._2_2_];
      fVar14 = (&pPVar9->x)[(short)cc_1._2_2_];
      if (dv2_1 * dv0dv1_1 <= 0.0) {
        if (0.0 < dv2_1 * dv0dv2_1) {
          x0_1 = (fVar15 - c_3) * dv0dv1_1;
          x1_1 = (fVar16 - c_3) * dv0dv1_1;
          d_2 = dv0dv1_1 - dv2_1;
          e_1 = dv0dv1_1 - dv0dv2_1;
        }
        else if (((0.0 < dv0dv1_1 * dv0dv2_1) || (dv2_1 != 0.0)) || (NAN(dv2_1))) {
          x0_1 = (c_3 - fVar15) * dv2_1;
          x1_1 = (fVar16 - fVar15) * dv2_1;
          d_2 = dv2_1 - dv0dv1_1;
          e_1 = dv2_1 - dv0dv2_1;
          c_3 = fVar15;
        }
        else {
          if ((dv0dv1_1 != 0.0) || (NAN(dv0dv1_1))) {
            x0_1 = (fVar15 - c_3) * dv0dv1_1;
            x1_1 = (fVar16 - c_3) * dv0dv1_1;
            e_1 = dv0dv1_1 - dv0dv2_1;
            dv0dv2_1 = dv0dv1_1;
          }
          else {
            if ((dv0dv2_1 == 0.0) && (!NAN(dv0dv2_1))) {
              local_a24 = CoplanarTriTri((Point *)local_a90,pPVar13,pPVar12,pPVar11,pPVar7,pPVar8,
                                         pPVar9);
              goto LAB_0028a006;
            }
            x0_1 = (fVar15 - fVar16) * dv0dv2_1;
            x1_1 = (c_3 - fVar16) * dv0dv2_1;
            e_1 = dv0dv2_1 - dv0dv1_1;
            c_3 = fVar16;
          }
          d_2 = dv0dv2_1 - dv2_1;
        }
      }
      else {
        x0_1 = (fVar15 - fVar16) * dv0dv2_1;
        x1_1 = (c_3 - fVar16) * dv0dv2_1;
        d_2 = dv0dv2_1 - dv2_1;
        e_1 = dv0dv2_1 - dv0dv1_1;
        c_3 = fVar16;
      }
      if (du2_1 * du0du1_1 <= 0.0) {
        if (du2_1 * du0du2_1 <= 0.0) {
          if (((0.0 < du0du1_1 * du0du2_1) || (du2_1 != 0.0)) || (NAN(du2_1))) {
            y0_1 = (f_1 - fVar17) * du2_1;
            y1_1 = (fVar14 - fVar17) * du2_1;
            xx_1 = du2_1 - du0du1_1;
            yy_1 = du2_1 - du0du2_1;
            f_1 = fVar17;
          }
          else {
            if ((du0du1_1 != 0.0) || (NAN(du0du1_1))) {
              y0_1 = (fVar17 - f_1) * du0du1_1;
              y1_1 = (fVar14 - f_1) * du0du1_1;
              yy_1 = du0du1_1 - du0du2_1;
              du0du2_1 = du0du1_1;
            }
            else {
              if ((du0du2_1 == 0.0) && (!NAN(du0du2_1))) {
                local_a24 = CoplanarTriTri((Point *)local_a90,pPVar13,pPVar12,pPVar11,pPVar7,pPVar8,
                                           pPVar9);
                goto LAB_0028a006;
              }
              y0_1 = (fVar17 - fVar14) * du0du2_1;
              y1_1 = (f_1 - fVar14) * du0du2_1;
              yy_1 = du0du2_1 - du0du1_1;
              f_1 = fVar14;
            }
            xx_1 = du0du2_1 - du2_1;
          }
        }
        else {
          y0_1 = (fVar17 - f_1) * du0du1_1;
          y1_1 = (fVar14 - f_1) * du0du1_1;
          xx_1 = du0du1_1 - du2_1;
          yy_1 = du0du1_1 - du0du2_1;
        }
      }
      else {
        y0_1 = (fVar17 - fVar14) * du0du2_1;
        y1_1 = (f_1 - fVar14) * du0du2_1;
        xx_1 = du0du2_1 - du2_1;
        yy_1 = du0du2_1 - du0du1_1;
        f_1 = fVar14;
      }
      fVar15 = d_2 * e_1;
      fVar16 = xx_1 * yy_1;
      fVar17 = c_3 * fVar15 * fVar16;
      fVar14 = x0_1 * e_1 * fVar16 + fVar17;
      isect2_1[1] = x1_1 * d_2 * fVar16 + fVar17;
      fVar16 = f_1 * fVar15 * fVar16;
      fVar17 = y0_1 * fVar15 * yy_1 + fVar16;
      tmp_10 = y1_1 * fVar15 * xx_1 + fVar16;
      isect2_1[0] = fVar14;
      if (isect2_1[1] < fVar14) {
        isect2_1[0] = isect2_1[1];
        isect2_1[1] = fVar14;
      }
      c_4 = fVar17;
      if (tmp_10 < fVar17) {
        c_4 = tmp_10;
        tmp_10 = fVar17;
      }
      if ((isect2_1[1] < c_4) || (tmp_10 < isect2_1[0])) {
        local_a24 = 0;
      }
      else {
        local_a24 = 1;
      }
    }
    else {
      local_a24 = 0;
    }
  }
  else {
    local_a24 = 0;
  }
LAB_0028a006:
  if (local_a24 != 0) {
    pCVar10 = &this->mPairs;
    uVar1 = this->mLeafIndex;
    if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
      IceCore::Container::Resize(pCVar10,1);
    }
    uVar2 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar2 + 1;
    (this->mPairs).mEntries[uVar2] = uVar1;
    if ((this->mPairs).mCurNbEntries == pCVar10->mMaxNbEntries) {
      IceCore::Container::Resize(pCVar10,1);
    }
    uVar2 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar2 + 1;
    (this->mPairs).mEntries[uVar2] = uVar5;
    (this->super_Collider).mFlags = (this->super_Collider).mFlags | 4;
  }
  return;
}

Assistant:

void AABBTreeCollider::_CollideTriBox(const AABBQuantizedNoLeafNode* b)
{
	// Dequantize box
	const QuantizedAABB* bb = &b->mAABB;
	const Point Pb(float(bb->mCenter[0]) * mCenterCoeff1.x, float(bb->mCenter[1]) * mCenterCoeff1.y, float(bb->mCenter[2]) * mCenterCoeff1.z);
	const Point eb(float(bb->mExtents[0]) * mExtentsCoeff1.x, float(bb->mExtents[1]) * mExtentsCoeff1.y, float(bb->mExtents[2]) * mExtentsCoeff1.z);

	// Perform triangle-box overlap test
	if(!TriBoxOverlap(Pb, eb))	return;

	if(b->HasPosLeaf())	PrimTestTriIndex(b->GetPosPrimitive());
	else				_CollideTriBox(b->GetPos());

	if(ContactFound()) return;

	if(b->HasNegLeaf())	PrimTestTriIndex(b->GetNegPrimitive());
	else				_CollideTriBox(b->GetNeg());
}